

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::Write(ON_PolylineCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteArray(file,(ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteArray(file,&this->m_t);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteInt(file,this->m_dim);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ON_PolylineCurve::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    if (rc) rc = file.WriteArray( m_pline );
    if (rc) rc = file.WriteArray( m_t );
    if (rc) rc = file.WriteInt(m_dim);
  }
  return rc;
}